

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenGEXImporter.cpp
# Opt level: O0

void __thiscall
Assimp::OpenGEX::OpenGEXImporter::handleVertexArrayNode
          (OpenGEXImporter *this,DDLNode *node,aiScene *param_2)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  MeshAttribute MVar3;
  DeadlyImportError *this_00;
  Property *prop_00;
  char *attribName;
  DataArrayList *vaList_00;
  size_t numItems_00;
  aiVector3t<float> *paVar4;
  ulong uVar5;
  aiColor4D *paVar6;
  aiVector3D *paVar7;
  aiVector3t<float> *local_158;
  aiColor4t<float> *local_120;
  size_t numItems;
  DataArrayList *vaList;
  undefined1 local_a0 [4];
  MeshAttribute attribType;
  string propKey;
  string propName;
  Property *prop;
  allocator local_41;
  string local_40;
  aiScene *local_20;
  aiScene *param_2_local;
  DDLNode *node_local;
  OpenGEXImporter *this_local;
  
  local_20 = param_2;
  param_2_local = (aiScene *)node;
  node_local = (DDLNode *)this;
  if (node == (DDLNode *)0x0) {
    this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_40,"No parent node for name.",&local_41);
    DeadlyImportError::DeadlyImportError(this_00,&local_40);
    __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  prop_00 = ODDLParser::DDLNode::getProperties(node);
  if (prop_00 != (Property *)0x0) {
    std::__cxx11::string::string((string *)(propKey.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_a0);
    propId2StdString(prop_00,(string *)(propKey.field_2._M_local_buf + 8),(string *)local_a0);
    attribName = (char *)std::__cxx11::string::c_str();
    MVar3 = getAttributeByName(attribName);
    if ((MVar3 != None) &&
       (vaList_00 = ODDLParser::DDLNode::getDataArrayList((DDLNode *)param_2_local),
       vaList_00 != (DataArrayList *)0x0)) {
      numItems_00 = countDataArrayListItems(vaList_00);
      if (MVar3 == Position) {
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                  (&(this->m_currentVertices).m_vertices,numItems_00);
        paVar4 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::data
                           (&(this->m_currentVertices).m_vertices);
        copyVectorArray(numItems_00,vaList_00,paVar4);
      }
      else if (MVar3 == Color) {
        (this->m_currentVertices).m_numColors = numItems_00;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = numItems_00;
        uVar5 = SUB168(auVar1 * ZEXT816(0x10),0);
        if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
          uVar5 = 0xffffffffffffffff;
        }
        paVar6 = (aiColor4D *)operator_new__(uVar5);
        if (numItems_00 != 0) {
          local_120 = paVar6;
          do {
            aiColor4t<float>::aiColor4t(local_120);
            local_120 = local_120 + 1;
          } while (local_120 != paVar6 + numItems_00);
        }
        (this->m_currentVertices).m_colors = paVar6;
        copyColor4DArray(numItems_00,vaList_00,(this->m_currentVertices).m_colors);
      }
      else if (MVar3 == Normal) {
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                  (&(this->m_currentVertices).m_normals,numItems_00);
        paVar4 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::data
                           (&(this->m_currentVertices).m_normals);
        copyVectorArray(numItems_00,vaList_00,paVar4);
      }
      else if (MVar3 == TexCoord) {
        (this->m_currentVertices).m_numUVComps[0] = numItems_00;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = numItems_00;
        uVar5 = SUB168(auVar2 * ZEXT816(0xc),0);
        if (SUB168(auVar2 * ZEXT816(0xc),8) != 0) {
          uVar5 = 0xffffffffffffffff;
        }
        paVar7 = (aiVector3D *)operator_new__(uVar5);
        if (numItems_00 != 0) {
          local_158 = paVar7;
          do {
            aiVector3t<float>::aiVector3t(local_158);
            local_158 = local_158 + 1;
          } while (local_158 != paVar7 + numItems_00);
        }
        (this->m_currentVertices).m_textureCoords[0] = paVar7;
        copyVectorArray(numItems_00,vaList_00,(this->m_currentVertices).m_textureCoords[0]);
      }
    }
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::string::~string((string *)(propKey.field_2._M_local_buf + 8));
  }
  return;
}

Assistant:

void OpenGEXImporter::handleVertexArrayNode( ODDLParser::DDLNode *node, aiScene * /*pScene*/ ) {
    if( nullptr == node ) {
        throw DeadlyImportError( "No parent node for name." );
        return;
    }

    Property *prop( node->getProperties() );
    if( nullptr != prop ) {
        std::string propName, propKey;
        propId2StdString( prop, propName, propKey );
        MeshAttribute attribType( getAttributeByName( propKey.c_str() ) );
        if( None == attribType ) {
            return;
        }

        DataArrayList *vaList = node->getDataArrayList();
        if( nullptr == vaList ) {
            return;
        }

        const size_t numItems( countDataArrayListItems( vaList ) );

        if( Position == attribType ) {
            m_currentVertices.m_vertices.resize( numItems );
            copyVectorArray( numItems, vaList, m_currentVertices.m_vertices.data() );
        } else if ( Color == attribType ) {
            m_currentVertices.m_numColors = numItems;
            m_currentVertices.m_colors = new aiColor4D[ numItems ];
            copyColor4DArray( numItems, vaList, m_currentVertices.m_colors );
        } else if( Normal == attribType ) {
            m_currentVertices.m_normals.resize( numItems );
            copyVectorArray( numItems, vaList, m_currentVertices.m_normals.data() );
        } else if( TexCoord == attribType ) {
            m_currentVertices.m_numUVComps[ 0 ] = numItems;
            m_currentVertices.m_textureCoords[ 0 ] = new aiVector3D[ numItems ];
            copyVectorArray( numItems, vaList, m_currentVertices.m_textureCoords[ 0 ] );
        }
    }
}